

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

int __thiscall xmrig::Client::close(Client *this,int __fd)

{
  Client *pCVar1;
  bool bVar2;
  Client *unaff_retaddr;
  SocketState in_stack_fffffffffffffffc;
  
  if ((this->super_BaseClient).m_state == ClosingState) {
    bVar2 = this->m_socket != (uv_tcp_t *)0x0;
    pCVar1 = (Client *)CONCAT71((int7)((ulong)this >> 8),bVar2);
  }
  else if (((this->super_BaseClient).m_state == UnconnectedState) ||
          (this->m_socket == (uv_tcp_t *)0x0)) {
    bVar2 = false;
    pCVar1 = this;
  }
  else {
    setState(unaff_retaddr,in_stack_fffffffffffffffc);
    pCVar1 = (Client *)uv_is_closing(this->m_socket);
    if ((int)pCVar1 == 0) {
      pCVar1 = (Client *)uv_close(this->m_socket,onClose);
    }
    bVar2 = true;
  }
  return (int)CONCAT71((int7)((ulong)pCVar1 >> 8),bVar2);
}

Assistant:

bool xmrig::Client::close()
{
    if (m_state == ClosingState) {
        return m_socket != nullptr;
    }

    if (m_state == UnconnectedState || m_socket == nullptr) {
        return false;
    }

    setState(ClosingState);

    if (uv_is_closing(reinterpret_cast<uv_handle_t*>(m_socket)) == 0) {
        uv_close(reinterpret_cast<uv_handle_t*>(m_socket), Client::onClose);
    }

    return true;
}